

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O1

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setTiming(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,TYPE ttype)

{
  Timer *pTVar1;
  
  pTVar1 = TimerFactory::switchTimer(this->theTime,ttype);
  this->theTime = pTVar1;
  pTVar1 = TimerFactory::switchTimer(this->multTimeSparse,ttype);
  this->multTimeSparse = pTVar1;
  pTVar1 = TimerFactory::switchTimer(this->multTimeFull,ttype);
  this->multTimeFull = pTVar1;
  pTVar1 = TimerFactory::switchTimer(this->multTimeColwise,ttype);
  this->multTimeColwise = pTVar1;
  pTVar1 = TimerFactory::switchTimer(this->multTimeUnsetup,ttype);
  this->multTimeUnsetup = pTVar1;
  this->timerType = ttype;
  return;
}

Assistant:

void setTiming(Timer::TYPE ttype)
   {
      theTime = TimerFactory::switchTimer(theTime, ttype);
      multTimeSparse = TimerFactory::switchTimer(multTimeSparse, ttype);
      multTimeFull = TimerFactory::switchTimer(multTimeFull, ttype);
      multTimeColwise = TimerFactory::switchTimer(multTimeColwise, ttype);
      multTimeUnsetup = TimerFactory::switchTimer(multTimeUnsetup, ttype);
      timerType = ttype;
   }